

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

bool __thiscall CGL::SceneObjects::Sphere::intersect(Sphere *this,Ray *r,Intersection *i)

{
  bool bVar1;
  undefined8 uVar2;
  Vector3D *v;
  undefined8 *in_RDX;
  long in_RSI;
  Vector3D *in_RDI;
  Ray *unaff_retaddr;
  Sphere *in_stack_00000008;
  Vector3D isect_p;
  double t2;
  double t1;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 local_98;
  Vector3D *in_stack_ffffffffffffff70;
  Sphere *in_stack_ffffffffffffff78;
  undefined8 local_80;
  Vector3D local_58;
  undefined8 local_28;
  undefined8 *local_20;
  long local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = test(in_stack_00000008,unaff_retaddr,
               (double *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               (double *)in_RDI);
  if (bVar1) {
    *(undefined8 *)(local_18 + 0x58) = local_28;
    uVar2 = (**(code **)((long)(in_RDI->field_0).field_0.x + 0x18))();
    local_20[6] = uVar2;
    local_20[1] = in_RDI;
    *local_20 = local_28;
    v = (Vector3D *)(local_18 + 0x10);
    CGL::operator*((double *)in_stack_ffffffffffffff48,in_RDI);
    Vector3D::operator+(in_RDI,v);
    Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffff48,&local_58);
    normal(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_20[2] = local_98;
    local_20[3] = in_stack_ffffffffffffff70;
    local_20[4] = in_stack_ffffffffffffff78;
    local_20[5] = local_80;
  }
  return bVar1;
}

Assistant:

bool Sphere::intersect(const Ray &r, Intersection *i) const {

  // TODO (Part 1.4):
  // Implement ray - sphere intersection.
  // Note again that you might want to use the the Sphere::test helper here.
  // When an intersection takes place, the Intersection data should be updated
  // correspondingly.
  double t1, t2;
  if (! test(r, t1, t2) ) {
    return false;
  }

  r.max_t = t1;

  // populate isect
  i->bsdf = this->get_bsdf();
  i->primitive = this;
  i->t = t1;

  // get normal vector and save to isect
  Vector3D isect_p = r.o + t1 * r.d;
  i->n = this->normal(isect_p);

  return true;
}